

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<1ul,int>(Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
                *this,char (*params) [7])

{
  SiPair *pSVar1;
  long lVar2;
  uint in_EDX;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  SiPair *pSVar8;
  
  pSVar1 = *(SiPair **)(params[0xd] + 5);
  if (pSVar1 == (SiPair *)0x0) {
    uVar4 = 0;
  }
  else {
    lVar2 = *(long *)(params[0xc] + 4);
    uVar5 = in_EDX * 0x8000 + ~in_EDX;
    uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
    uVar6 = (uVar5 >> 4 ^ uVar5) * 0x809;
    uVar6 = uVar6 >> 0x10 ^ uVar6;
    uVar7 = (ulong)((int)pSVar1 - 1U & uVar6);
    uVar5 = *(uint *)(lVar2 + 4 + uVar7 * 8);
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    else {
      puVar3 = (uint *)(lVar2 + uVar7 * 8);
      uVar4 = 0;
      do {
        if (((uVar5 != 1) && (*puVar3 == uVar6)) &&
           (*(uint *)(*(long *)params + 0x10 + (ulong)(uVar5 - 2) * 0x18) == in_EDX)) {
          uVar4 = *(long *)params + (ulong)(uVar5 - 2) * 0x18;
          break;
        }
        pSVar8 = (SiPair *)(uVar7 + 1);
        uVar7 = (ulong)pSVar8 & 0xffffffff;
        if (pSVar8 == pSVar1) {
          uVar7 = uVar4;
        }
        puVar3 = (uint *)(lVar2 + uVar7 * 8);
        uVar5 = puVar3[1];
      } while (uVar5 != 0);
    }
  }
  *(ulong *)this = uVar4;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)pSVar1;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}